

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O0

void Aig_RManPrintVarProfile(uint *pTruth,int nVars,uint *pTruthAux)

{
  int local_ac;
  uint local_a8;
  int i;
  int pStore2 [32];
  uint *pTruthAux_local;
  int nVars_local;
  uint *pTruth_local;
  
  Kit_TruthCountOnesInCofsSlow(pTruth,nVars,(int *)&local_a8,pTruthAux);
  for (local_ac = 0; local_ac < nVars; local_ac = local_ac + 1) {
    printf("%2d/%2d ",(ulong)(&local_a8)[local_ac << 1],(ulong)(&local_a8)[local_ac * 2 + 1]);
  }
  printf("\n");
  return;
}

Assistant:

void Aig_RManPrintVarProfile( unsigned * pTruth, int nVars,  unsigned * pTruthAux )
{
    int pStore2[32];
    int i;
    Kit_TruthCountOnesInCofsSlow( pTruth, nVars, pStore2, pTruthAux );
    for ( i = 0; i < nVars; i++ )
        printf( "%2d/%2d ", pStore2[2*i], pStore2[2*i+1] );
    printf( "\n" );
}